

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_redrawallfortemplatecanvas(_glist *x,int action)

{
  t_template *x_00;
  int iVar1;
  t_symbol *ptVar2;
  t_object *ptVar3;
  t_atom *ptVar4;
  char *template;
  
  template = "struct";
  ptVar2 = gensym("struct");
  for (x_00 = (t_template *)x->gl_list; x_00 != (t_template *)0x0;
      x_00 = (t_template *)((word *)&x_00->t_list)->w_symbol) {
    template = (char *)x_00;
    ptVar3 = pd_checkobject(&x_00->t_pdobj);
    if ((ptVar3 != (t_object *)0x0) && ((ptVar3->field_0x2e & 3) == 1)) {
      template = (char *)ptVar3->te_binbuf;
      iVar1 = binbuf_getnatom((_binbuf *)template);
      if (1 < iVar1) {
        template = (char *)ptVar3->te_binbuf;
        ptVar4 = binbuf_getvec((_binbuf *)template);
        if (((ptVar4->a_type == A_SYMBOL) && (ptVar4[1].a_type == A_SYMBOL)) &&
           ((ptVar4->a_w).w_symbol == ptVar2)) {
          template = (char *)ptVar4[1].a_w.w_symbol;
          template_findbyname((t_symbol *)template);
          canvas_redrawallfortemplate((t_template *)template,action);
        }
      }
    }
  }
  canvas_redrawallfortemplate((t_template *)template,action);
  return;
}

Assistant:

void canvas_redrawallfortemplatecanvas(t_canvas *x, int action)
{
    t_gobj *g;
    t_template *tmpl;
    t_symbol *s1 = gensym("struct");
    for (g = x->gl_list; g; g = g->g_next)
    {
        t_object *ob = pd_checkobject(&g->g_pd);
        t_atom *argv;
        if (!ob || ob->te_type != T_OBJECT ||
            binbuf_getnatom(ob->te_binbuf) < 2)
            continue;
        argv = binbuf_getvec(ob->te_binbuf);
        if (argv[0].a_type != A_SYMBOL || argv[1].a_type != A_SYMBOL
            || argv[0].a_w.w_symbol != s1)
                continue;
        tmpl = template_findbyname(argv[1].a_w.w_symbol);
        canvas_redrawallfortemplate(tmpl, action);
    }
    canvas_redrawallfortemplate(0, action);
}